

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O0

void BrotliBuildCodeLengthsHuffmanTable(HuffmanCode *table,uint8_t *code_lengths,uint16_t *count)

{
  byte bVar1;
  int iVar2;
  uint local_e0;
  int local_dc;
  int bits_count;
  int bits;
  int offset [6];
  int local_b8 [2];
  int sorted [18];
  int table_size;
  int step;
  uint64_t key_step;
  uint64_t key;
  int symbol;
  HuffmanCode code;
  uint16_t *count_local;
  uint8_t *code_lengths_local;
  HuffmanCode *table_local;
  HuffmanCode h_1;
  int local_28;
  HuffmanCode h;
  
  bits = count[1] - 1;
  offset[0] = (uint)count[2] + (count[1] - 1);
  offset[1] = (uint)count[3] + offset[0];
  offset[2] = (uint)count[4] + offset[1];
  offset[3] = (uint)count[5] + offset[2];
  bits_count = 0x11;
  key._0_4_ = 0x12;
  do {
    iVar2 = (&bits_count)[code_lengths[(int)key + -1]];
    (&bits_count)[code_lengths[(int)key + -1]] = iVar2 + -1;
    local_b8[iVar2] = (int)key + -1;
    iVar2 = (&bits_count)[code_lengths[(int)key + -2]];
    (&bits_count)[code_lengths[(int)key + -2]] = iVar2 + -1;
    local_b8[iVar2] = (int)key + -2;
    iVar2 = (&bits_count)[code_lengths[(int)key + -3]];
    (&bits_count)[code_lengths[(int)key + -3]] = iVar2 + -1;
    local_b8[iVar2] = (int)key + -3;
    iVar2 = (&bits_count)[code_lengths[(int)key + -4]];
    (&bits_count)[code_lengths[(int)key + -4]] = iVar2 + -1;
    local_b8[iVar2] = (int)key + -4;
    iVar2 = (&bits_count)[code_lengths[(int)key + -5]];
    (&bits_count)[code_lengths[(int)key + -5]] = iVar2 + -1;
    local_b8[iVar2] = (int)key + -5;
    key._0_4_ = (int)key + -6;
    iVar2 = (&bits_count)[code_lengths[(int)key]];
    (&bits_count)[code_lengths[(int)key]] = iVar2 + -1;
    local_b8[iVar2] = (int)key;
  } while ((int)key != 0);
  sorted[0x10] = 0x20;
  if (bits_count == 0) {
    h_1 = (HuffmanCode)(CONCAT22((short)local_b8[0],h_1._0_2_) & 0xffffff00);
    for (key_step = 0; key_step < 0x20; key_step = key_step + 1) {
      table[key_step] = h_1;
    }
  }
  else {
    key_step = 0;
    _table_size = 0x80;
    key._0_4_ = 0;
    local_dc = 1;
    sorted[0x11] = 2;
    do {
      for (local_e0 = (uint)count[local_dc]; local_e0 != 0; local_e0 = local_e0 - 1) {
        table_local._4_4_ = (HuffmanCode)CONCAT31(table_local._5_3_,(char)local_dc);
        table_local._4_4_ = (HuffmanCode)CONCAT22((uint16_t)local_b8[(int)key],table_local._4_2_);
        bVar1 = kReverseBits[key_step];
        local_28 = 0x20;
        do {
          local_28 = local_28 - sorted[0x11];
          table[(ulong)bVar1 + (long)local_28] = table_local._4_4_;
        } while (0 < local_28);
        key_step = _table_size + key_step;
        key._0_4_ = (int)key + 1;
      }
      sorted[0x11] = sorted[0x11] << 1;
      _table_size = _table_size >> 1;
      local_dc = local_dc + 1;
    } while (local_dc < 6);
  }
  return;
}

Assistant:

void BrotliBuildCodeLengthsHuffmanTable(HuffmanCode* table,
                                        const uint8_t* const code_lengths,
                                        uint16_t* count) {
  HuffmanCode code;       /* current table entry */
  int symbol;             /* symbol index in original or sorted table */
  brotli_reg_t key;       /* prefix code */
  brotli_reg_t key_step;  /* prefix code addend */
  int step;               /* step size to replicate values in current table */
  int table_size;         /* size of current table */
  int sorted[BROTLI_CODE_LENGTH_CODES];  /* symbols sorted by code length */
  /* offsets in sorted table for each length */
  int offset[BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1];
  int bits;
  int bits_count;
  BROTLI_DCHECK(BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH <=
                BROTLI_REVERSE_BITS_MAX);

  /* Generate offsets into sorted symbol table by code length. */
  symbol = -1;
  bits = 1;
  BROTLI_REPEAT(BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH, {
    symbol += count[bits];
    offset[bits] = symbol;
    bits++;
  });
  /* Symbols with code length 0 are placed after all other symbols. */
  offset[0] = BROTLI_CODE_LENGTH_CODES - 1;

  /* Sort symbols by length, by symbol order within each length. */
  symbol = BROTLI_CODE_LENGTH_CODES;
  do {
    BROTLI_REPEAT(6, {
      symbol--;
      sorted[offset[code_lengths[symbol]]--] = symbol;
    });
  } while (symbol != 0);

  table_size = 1 << BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH;

  /* Special case: all symbols but one have 0 code length. */
  if (offset[0] == 0) {
    code = ConstructHuffmanCode(0, (uint16_t)sorted[0]);
    for (key = 0; key < (brotli_reg_t)table_size; ++key) {
      table[key] = code;
    }
    return;
  }

  /* Fill in table. */
  key = 0;
  key_step = BROTLI_REVERSE_BITS_LOWEST;
  symbol = 0;
  bits = 1;
  step = 2;
  do {
    for (bits_count = count[bits]; bits_count != 0; --bits_count) {
      code = ConstructHuffmanCode((uint8_t)bits, (uint16_t)sorted[symbol++]);
      ReplicateValue(&table[BrotliReverseBits(key)], step, table_size, code);
      key += key_step;
    }
    step <<= 1;
    key_step >>= 1;
  } while (++bits <= BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH);
}